

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

TokenOrSyntax * __thiscall
slang::syntax::BeginKeywordsDirectiveSyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,BeginKeywordsDirectiveSyntax *this,size_t index)

{
  Token local_20;
  
  if (index == 1) {
    local_20.kind = (this->versionSpecifier).kind;
    local_20._2_1_ = (this->versionSpecifier).field_0x2;
    local_20.numFlags.raw = (this->versionSpecifier).numFlags.raw;
    local_20.rawLen = (this->versionSpecifier).rawLen;
    local_20.info._0_4_ = *(undefined4 *)&(this->versionSpecifier).info;
    local_20.info._4_4_ = *(undefined4 *)((long)&(this->versionSpecifier).info + 4);
  }
  else if (index == 0) {
    local_20.kind = (this->super_DirectiveSyntax).directive.kind;
    local_20._2_1_ = (this->super_DirectiveSyntax).directive.field_0x2;
    local_20.numFlags.raw = (this->super_DirectiveSyntax).directive.numFlags.raw;
    local_20.rawLen = (this->super_DirectiveSyntax).directive.rawLen;
    local_20.info._0_4_ = *(undefined4 *)&(this->super_DirectiveSyntax).directive.info;
    local_20.info._4_4_ = *(undefined4 *)((long)&(this->super_DirectiveSyntax).directive.info + 4);
  }
  else {
    parsing::Token::Token(&local_20);
  }
  *(undefined4 *)
   &(__return_storage_ptr__->super_ConstTokenOrSyntax).
    super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> =
       local_20._0_4_;
  *(uint32_t *)
   ((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> + 4) =
       local_20.rawLen;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> + 8) =
       local_20.info._0_4_;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> + 0xc) =
       local_20.info._4_4_;
  *(__index_type *)
   ((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> + 0x10)
       = '\0';
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax BeginKeywordsDirectiveSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return directive;
        case 1: return versionSpecifier;
        default: return nullptr;
    }
}